

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cc
# Opt level: O0

ts_nsec timed_fdb_snapshot(fdb_kvs_handle *kv,fdb_kvs_handle **snap_kv)

{
  fdb_status fVar1;
  ts_nsec start_00;
  ts_nsec end_00;
  fdb_status status;
  ts_nsec end;
  ts_nsec start;
  fdb_seqnum_t in_stack_00000270;
  fdb_kvs_handle **in_stack_00000278;
  fdb_kvs_handle *in_stack_00000280;
  undefined8 local_8;
  
  start_00 = get_monotonic_ts();
  fVar1 = fdb_snapshot_open(in_stack_00000280,in_stack_00000278,in_stack_00000270);
  end_00 = get_monotonic_ts();
  if (fVar1 == FDB_RESULT_SUCCESS) {
    local_8 = ts_diff(start_00,end_00);
  }
  else {
    local_8 = 0xffffffff;
  }
  return local_8;
}

Assistant:

ts_nsec timed_fdb_snapshot(fdb_kvs_handle *kv, fdb_kvs_handle **snap_kv){

    ts_nsec start, end;
    fdb_status status;

    start = get_monotonic_ts();
    status = fdb_snapshot_open(kv, snap_kv, FDB_SNAPSHOT_INMEM);
    end = get_monotonic_ts();

    if(status == FDB_RESULT_SUCCESS){
      return ts_diff(start, end);
    } else {
      return ERR_NS;
    }

}